

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_encoder.c
# Opt level: O0

aom_fixed_buf_t * aom_codec_get_global_headers(aom_codec_ctx_t *ctx)

{
  aom_codec_get_global_headers_fn_t_conflict p_Var1;
  aom_codec_alg_priv_t_conflict *paVar2;
  aom_codec_ctx_t *in_RDI;
  aom_fixed_buf_t *buf;
  aom_fixed_buf_t *local_10;
  
  local_10 = (aom_fixed_buf_t *)0x0;
  if (in_RDI != (aom_codec_ctx_t *)0x0) {
    if ((in_RDI->iface == (aom_codec_iface_t *)0x0) || (in_RDI->priv == (aom_codec_priv_t *)0x0)) {
      in_RDI->err = AOM_CODEC_ERROR;
    }
    else if ((in_RDI->iface->caps & 2U) == 0) {
      in_RDI->err = AOM_CODEC_INCAPABLE;
    }
    else if ((in_RDI->iface->enc).get_glob_hdrs == (aom_codec_get_global_headers_fn_t_conflict)0x0)
    {
      in_RDI->err = AOM_CODEC_INCAPABLE;
    }
    else {
      p_Var1 = (in_RDI->iface->enc).get_glob_hdrs;
      paVar2 = (aom_codec_alg_priv_t_conflict *)get_alg_priv(in_RDI);
      local_10 = (*p_Var1)(paVar2);
    }
  }
  return local_10;
}

Assistant:

aom_fixed_buf_t *aom_codec_get_global_headers(aom_codec_ctx_t *ctx) {
  aom_fixed_buf_t *buf = NULL;

  if (ctx) {
    if (!ctx->iface || !ctx->priv)
      ctx->err = AOM_CODEC_ERROR;
    else if (!(ctx->iface->caps & AOM_CODEC_CAP_ENCODER))
      ctx->err = AOM_CODEC_INCAPABLE;
    else if (!ctx->iface->enc.get_glob_hdrs)
      ctx->err = AOM_CODEC_INCAPABLE;
    else
      buf = ctx->iface->enc.get_glob_hdrs(get_alg_priv(ctx));
  }

  return buf;
}